

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DistItemSyntax::setChild(DistItemSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  DistWeightSyntax *pDVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  
  ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  if (index == 0) {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar3 = *ppSVar1;
    }
    (this->range).ptr = (ExpressionSyntax *)pSVar3;
  }
  else {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pDVar2 = (DistWeightSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pDVar2 = (DistWeightSyntax *)*ppSVar1;
    }
    this->weight = pDVar2;
  }
  return;
}

Assistant:

void DistItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: range = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: weight = child.node() ? &child.node()->as<DistWeightSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}